

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void cashew::ValueBuilder::appendCaseToSwitch(Ref switch_,Ref arg)

{
  Value *this;
  char cVar1;
  Ref *this_00;
  undefined8 *puVar2;
  Ref RVar3;
  Value *this_01;
  Value *local_28;
  Ref switch__local;
  
  local_28 = switch_.inst;
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
  cVar1 = cashew::Ref::operator==(this_00,(IString *)&SWITCH);
  if (cVar1 != '\0') {
    puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
    this = (Value *)*puVar2;
    RVar3 = makeRawArray(2);
    this_01 = Value::push_back(RVar3.inst,arg);
    RVar3 = makeRawArray(0);
    RVar3.inst = Value::push_back(this_01,RVar3);
    Value::push_back(this,RVar3);
    return;
  }
  __assert_fail("switch_[0] == SWITCH",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x6e6,"static void cashew::ValueBuilder::appendCaseToSwitch(Ref, Ref)");
}

Assistant:

static void appendCaseToSwitch(Ref switch_, Ref arg) {
    assert(switch_[0] == SWITCH);
    switch_[2]->push_back(
      &makeRawArray(2)->push_back(arg).push_back(makeRawArray()));
  }